

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::MessageLite::CheckTypeAndMergeFrom(MessageLite *this,MessageLite *other)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Nullable<const_char_*> failure_msg;
  LogMessage *pLVar2;
  string_view sVar3;
  ClassData *data;
  LogMessage local_30;
  ClassData *other_data;
  
  iVar1 = (*this->_vptr_MessageLite[4])();
  data = (ClassData *)CONCAT44(extraout_var,iVar1);
  iVar1 = (*other->_vptr_MessageLite[4])(other);
  other_data = (ClassData *)CONCAT44(extraout_var_00,iVar1);
  failure_msg = absl::lts_20250127::log_internal::
                Check_EQImpl<google::protobuf::internal::ClassData_const*,google::protobuf::internal::ClassData_const*>
                          (&data,&other_data,"data == other_data");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    (*data->merge_to_from)(this,other);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.cc"
             ,0x51,failure_msg);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (&local_30,
                      (char (*) [53])"Invalid call to CheckTypeAndMergeFrom between types ");
  sVar3 = GetTypeName(this);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,sVar3);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,(char (*) [6])" and ");
  sVar3 = GetTypeName(other);
  absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,sVar3);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_30);
}

Assistant:

void MessageLite::CheckTypeAndMergeFrom(const MessageLite& other) {
  auto* data = GetClassData();
  auto* other_data = other.GetClassData();

  ABSL_CHECK_EQ(data, other_data)
      << "Invalid call to CheckTypeAndMergeFrom between types " << GetTypeName()
      << " and " << other.GetTypeName();
  data->merge_to_from(*this, other);
}